

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

IWindowPtr __thiscall cursespp::LayoutBase::GetFocus(LayoutBase *this)

{
  int iVar1;
  long lVar2;
  _func_int **pp_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar4;
  long lVar5;
  long *plVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar7 [16];
  IWindowPtr IVar8;
  
  iVar1 = *(int *)(in_RSI + 0x1f8);
  if (-1 < (long)iVar1) {
    lVar2 = *(long *)(in_RSI + 0x1e0);
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)(*(long *)(in_RSI + 0x1e8) - lVar2) >> 4);
    if (iVar1 < (int)in_RDX._M_pi) {
      lVar5 = (long)iVar1 * 0x10;
      pp_Var3 = *(_func_int ***)(lVar2 + lVar5);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 8 + lVar5);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      cVar4 = (**(code **)(*pp_Var3 + 0x118))(pp_Var3);
      in_RDX._M_pi = extraout_RDX;
      if (cVar4 != '\0') {
        auVar7 = __dynamic_cast(pp_Var3,&IWindow::typeinfo,&typeinfo,0);
        in_RDX._M_pi = auVar7._8_8_;
        plVar6 = auVar7._0_8_;
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x1d0))(this,plVar6);
          in_RDX._M_pi = extraout_RDX_00;
          if ((this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable !=
              (_func_int **)0x0) goto LAB_0016f5fc;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            in_RDX._M_pi = extraout_RDX_01;
          }
        }
        (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable = pp_Var3;
        (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
             (_func_int **)this_01;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
LAB_0016f5fc:
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        in_RDX._M_pi = extraout_RDX_02;
      }
      if (cVar4 != '\0') goto LAB_0016f614;
    }
  }
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable = (_func_int **)0x0;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable = (_func_int **)0x0;
LAB_0016f614:
  IVar8.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar8.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar8.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IWindowPtr LayoutBase::GetFocus() {
    if (this->focused >= 0 && (int) this->focusable.size() > this->focused) {
        auto view = this->focusable[this->focused];
        if (view->IsVisible()) {
            /* see if the currently focused view is a layout. if it is, see if it
            has something focused. if it does, return that. if it doesn't, just
            return the view itself. this is confusing, but allows nested circular
            layouts to function automatically */
            LayoutBase* asLayoutBase = dynamic_cast<LayoutBase*>(view.get());
            if (asLayoutBase) {
                auto focused = asLayoutBase->GetFocus();
                if (focused) {
                    return focused;
                }
            }
            return view;
        }
    }

    return IWindowPtr();
}